

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O0

ExchangeAbsolutePositionRequests __thiscall
adios2::aggregator::MPIChain::IExchangeAbsolutePosition(MPIChain *this,Buffer *buffer,int step)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int in_ECX;
  long in_RDX;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_00;
  __uniq_ptr_data<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>,_true,_true>
  extraout_RDX_01;
  tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  extraout_RDX_02;
  __uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  _Var2;
  long in_RSI;
  Req in_RDI;
  ExchangeAbsolutePositionRequests EVar3;
  int destination;
  ExchangeAbsolutePositionRequests *requests;
  Req *pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  long local_200;
  undefined8 local_1f8;
  int in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe18;
  string *message;
  int __val;
  string *activity;
  string *source;
  string *component;
  string local_1a8 [32];
  string local_188 [32];
  Req local_168 [5];
  string local_140 [16];
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  size_t in_stack_fffffffffffffed8;
  unsigned_long *in_stack_fffffffffffffee0;
  Comm *in_stack_fffffffffffffee8;
  _Head_base<0UL,_adios2::helper::CommReqImpl_*,_false> in_stack_ffffffffffffff00;
  undefined1 local_c9 [40];
  undefined1 local_a1 [40];
  undefined1 local_79 [40];
  undefined1 local_51 [53];
  int local_1c;
  long local_18;
  
  __val = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  if (*(int *)(in_RSI + 0x2c) == 1) {
    helper::Comm::Req::Req((Req *)0xd723ce);
    helper::Comm::Req::Req((Req *)0xd723dc);
    _Var2._M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
         extraout_RDX._M_t.
         super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  }
  else {
    local_1c = in_ECX;
    local_18 = in_RDX;
    if ((*(byte *)(in_RSI + 0x50) & 1) != 0) {
      component = (string *)local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_51 + 1),"Toolkit",(allocator *)component);
      source = (string *)local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_79 + 1),"aggregator::mpi::MPIChain",(allocator *)source);
      activity = (string *)local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_a1 + 1),"IExchangeAbsolutePosition",(allocator *)activity);
      message = (string *)local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_c9 + 1),"An existing exchange is still active",
                 (allocator *)message);
      helper::Throw<std::runtime_error>(component,source,activity,message,in_stack_fffffffffffffe14)
      ;
      __val = (int)((ulong)message >> 0x20);
      std::__cxx11::string::~string((string *)(local_c9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_c9);
      std::__cxx11::string::~string((string *)(local_a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_a1);
      std::__cxx11::string::~string((string *)(local_79 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_79);
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
    }
    if (local_1c == *(int *)(in_RSI + 0x2c) + -1) {
      iVar1 = 0;
    }
    else {
      iVar1 = local_1c + 1;
    }
    ExchangeAbsolutePositionRequests::ExchangeAbsolutePositionRequests
              ((ExchangeAbsolutePositionRequests *)
               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    if (local_1c == 0) {
      if (*(int *)(in_RSI + 0x28) == 0) {
        local_1f8 = *(undefined8 *)(local_18 + 0x38);
      }
      else {
        local_1f8 = *(undefined8 *)(local_18 + 0x30);
      }
      *(undefined8 *)(in_RSI + 0x58) = local_1f8;
    }
    if (*(int *)(in_RSI + 0x28) == local_1c) {
      if (*(int *)(in_RSI + 0x28) == 0) {
        local_200 = *(long *)(in_RSI + 0x58);
      }
      else {
        local_200 = *(long *)(in_RSI + 0x58) + *(long *)(local_18 + 0x38);
      }
      *(long *)(in_RSI + 0x60) = local_200;
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0);
      pRVar4 = (Req *)&stack0xffffffffffffff00;
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                 (string *)in_stack_ffffffffffffff00._M_head_impl);
      helper::Comm::Req::operator=((Req *)in_stack_fffffffffffffdd0,pRVar4);
      helper::Comm::Req::~Req((Req *)0xd7280e);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
      std::__cxx11::string::~string(local_140);
      _Var2._M_t.
      super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
      .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
           (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
           (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
           extraout_RDX_01.
           super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
    }
    else {
      _Var2._M_t.
      super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
      .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
           (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
           (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>)
           extraout_RDX_00.
           super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
      if (*(int *)(in_RSI + 0x28) == iVar1) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x20)
        ;
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_18 + 0x38);
        std::__cxx11::to_string(__val);
        std::operator+((char *)__lhs,__rhs);
        std::operator+(__lhs,(char *)__rhs);
        pRVar4 = local_168;
        helper::Comm::Irecv<unsigned_long>
                  (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                   (string *)in_stack_ffffffffffffff00._M_head_impl);
        helper::Comm::Req::operator=((Req *)__rhs,pRVar4);
        helper::Comm::Req::~Req((Req *)0xd729cb);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
        _Var2._M_t.
        super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
        .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
             (tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
              )(tuple<adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                )extraout_RDX_02.
                 super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                 .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
      }
    }
    *(undefined1 *)(in_RSI + 0x50) = 1;
  }
  EVar3.m_Recv.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>)
       _Var2._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  EVar3.m_Send.m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl =
       in_RDI.m_Impl._M_t.
       super___uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
  return EVar3;
}

Assistant:

MPIChain::ExchangeAbsolutePositionRequests
MPIChain::IExchangeAbsolutePosition(format::Buffer &buffer, const int step)
{
    if (m_Size == 1)
    {
        return {};
    }

    if (m_IsInExchangeAbsolutePosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "aggregator::mpi::MPIChain",
                                          "IExchangeAbsolutePosition",
                                          "An existing exchange is still active");
    }

    const int destination = (step != m_Size - 1) ? step + 1 : 0;
    ExchangeAbsolutePositionRequests requests;

    if (step == 0)
    {
        m_SizeSend = (m_Rank == 0) ? buffer.m_AbsolutePosition : buffer.m_Position;
    }

    if (m_Rank == step)
    {
        m_ExchangeAbsolutePosition =
            (m_Rank == 0) ? m_SizeSend : m_SizeSend + buffer.m_AbsolutePosition;

        requests.m_Send = m_Comm.Isend(&m_ExchangeAbsolutePosition, 1, destination, 0,
                                       ", aggregation Isend absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }
    else if (m_Rank == destination)
    {
        requests.m_Recv = m_Comm.Irecv(&buffer.m_AbsolutePosition, 1, step, 0,
                                       ", aggregation Irecv absolute position at iteration " +
                                           std::to_string(step) + "\n");
    }

    m_IsInExchangeAbsolutePosition = true;
    return requests;
}